

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O2

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::New(CordRepBtree *front,CordRepBtree *back)

{
  uint8_t uVar1;
  CordRepBtree *pCVar2;
  
  uVar1 = (front->super_CordRep).storage[0];
  if (uVar1 == (back->super_CordRep).storage[0]) {
    pCVar2 = (CordRepBtree *)operator_new(0x40);
    (pCVar2->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar2->super_CordRep).length = (back->super_CordRep).length + (front->super_CordRep).length;
    (pCVar2->super_CordRep).tag = '\x03';
    (pCVar2->super_CordRep).storage[0] = uVar1 + '\x01';
    (pCVar2->super_CordRep).storage[1] = '\0';
    (pCVar2->super_CordRep).storage[2] = '\x02';
    pCVar2->edges_[0] = &front->super_CordRep;
    pCVar2->edges_[1] = &back->super_CordRep;
    return pCVar2;
  }
  __assert_fail("front->height() == back->height()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x294,
                "static CordRepBtree *absl::cord_internal::CordRepBtree::New(CordRepBtree *, CordRepBtree *)"
               );
}

Assistant:

int height() const { return static_cast<int>(storage[0]); }